

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O1

void __thiscall MarkerIndex::rotate_node_right(MarkerIndex *this,Node *rotation_pivot)

{
  pointer *ppuVar1;
  Node *pNVar2;
  Node *pNVar3;
  uint *puVar4;
  Point PVar5;
  size_t sVar6;
  uint *__src;
  Node **ppNVar7;
  uint *puVar8;
  
  pNVar2 = rotation_pivot->parent;
  pNVar3 = pNVar2->parent;
  if (pNVar3 == (Node *)0x0) {
    ppNVar7 = &this->root;
  }
  else {
    ppNVar7 = &pNVar3->right;
    if (pNVar3->left == pNVar2) {
      ppNVar7 = &pNVar3->left;
    }
  }
  *ppNVar7 = rotation_pivot;
  rotation_pivot->parent = pNVar3;
  pNVar3 = rotation_pivot->right;
  pNVar2->left = pNVar3;
  if (pNVar3 != (Node *)0x0) {
    pNVar3->parent = pNVar2;
  }
  rotation_pivot->right = pNVar2;
  pNVar2->parent = rotation_pivot;
  PVar5 = Point::traversal(&pNVar2->left_extent,&rotation_pivot->left_extent);
  pNVar2->left_extent = PVar5;
  puVar8 = (pNVar2->left_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar8 != (pNVar2->left_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      sVar6 = flat_set<unsigned_int>::count(&rotation_pivot->start_marker_ids,*puVar8);
      if (sVar6 == 0) {
        flat_set<unsigned_int>::insert(&rotation_pivot->left_marker_ids,*puVar8);
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != (pNVar2->left_marker_ids).contents.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  puVar8 = (rotation_pivot->right_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar8 != (rotation_pivot->right_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      sVar6 = flat_set<unsigned_int>::count(&pNVar2->right_marker_ids,*puVar8);
      if (sVar6 == 0) {
        flat_set<unsigned_int>::insert(&pNVar2->left_marker_ids,*puVar8);
        __src = puVar8 + 1;
        puVar4 = (rotation_pivot->right_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__src != puVar4) {
          memmove(puVar8,__src,(long)puVar4 - (long)__src);
        }
        ppuVar1 = &(rotation_pivot->right_marker_ids).contents.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
      else {
        flat_set<unsigned_int>::erase(&pNVar2->right_marker_ids,*puVar8);
        puVar8 = puVar8 + 1;
      }
    } while (puVar8 != (rotation_pivot->right_marker_ids).contents.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void MarkerIndex::rotate_node_right(Node *rotation_pivot) {
  Node *rotation_root = rotation_pivot->parent;

  if (rotation_root->parent) {
    if (rotation_root->parent->left == rotation_root) {
      rotation_root->parent->left = rotation_pivot;
    } else {
      rotation_root->parent->right = rotation_pivot;
    }
  } else {
    root = rotation_pivot;
  }
  rotation_pivot->parent = rotation_root->parent;

  rotation_root->left = rotation_pivot->right;
  if (rotation_root->left) {
    rotation_root->left->parent = rotation_root;
  }

  rotation_pivot->right = rotation_root;
  rotation_root->parent = rotation_pivot;

  rotation_root->left_extent = rotation_root->left_extent.traversal(rotation_pivot->left_extent);

  for (auto it = rotation_root->left_marker_ids.begin(); it != rotation_root->left_marker_ids.end(); ++it) {
    if (!rotation_pivot->start_marker_ids.count(*it)) {
      rotation_pivot->left_marker_ids.insert(*it);
    }
  }

  for (auto it = rotation_pivot->right_marker_ids.begin(); it != rotation_pivot->right_marker_ids.end();) {
    if (rotation_root->right_marker_ids.count(*it)) {
      rotation_root->right_marker_ids.erase(*it);
      ++it;
    } else {
      rotation_root->left_marker_ids.insert(*it);
      it = rotation_pivot->right_marker_ids.erase(it);
    }
  }
}